

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O2

void coda_mem_type_delete(coda_dynamic_type *type)

{
  coda_backend cVar1;
  uint __line;
  coda_type *__ptr;
  char *__assertion;
  long lVar2;
  
  if (type == (coda_dynamic_type *)0x0) {
    __assertion = "type != NULL";
    __line = 0x2a;
  }
  else {
    if (type->backend == coda_backend_memory) {
      cVar1 = type[1].backend;
      if (cVar1 == 3) {
        if (*(coda_dynamic_type **)(type + 2) != (coda_dynamic_type *)0x0) {
          coda_dynamic_type_delete(*(coda_dynamic_type **)(type + 2));
        }
      }
      else {
        if (cVar1 == coda_backend_binary) {
          if (type[2].definition == (coda_type *)0x0) goto LAB_0015c715;
          for (lVar2 = 0; __ptr = type[2].definition, lVar2 < *(long *)(type + 2); lVar2 = lVar2 + 1
              ) {
            if (*(coda_dynamic_type **)(&__ptr->format + lVar2 * 2) != (coda_dynamic_type *)0x0) {
              coda_dynamic_type_delete(*(coda_dynamic_type **)(&__ptr->format + lVar2 * 2));
            }
          }
        }
        else {
          if ((cVar1 != coda_backend_ascii) || (type[2].definition == (coda_type *)0x0))
          goto LAB_0015c715;
          for (lVar2 = 0; __ptr = type[2].definition, lVar2 < *(long *)(type + 2); lVar2 = lVar2 + 1
              ) {
            if (*(coda_dynamic_type **)(&__ptr->format + lVar2 * 2) != (coda_dynamic_type *)0x0) {
              coda_dynamic_type_delete(*(coda_dynamic_type **)(&__ptr->format + lVar2 * 2));
            }
          }
        }
        free(__ptr);
      }
LAB_0015c715:
      if (type[1].definition != (coda_type *)0x0) {
        coda_dynamic_type_delete((coda_dynamic_type *)type[1].definition);
      }
      if (type->definition != (coda_type *)0x0) {
        coda_type_release(type->definition);
      }
      free(type);
      return;
    }
    __assertion = "type->backend == coda_backend_memory";
    __line = 0x2b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                ,__line,"void coda_mem_type_delete(coda_dynamic_type *)");
}

Assistant:

void coda_mem_type_delete(coda_dynamic_type *type)
{
    int i;

    assert(type != NULL);
    assert(type->backend == coda_backend_memory);

    switch (((coda_mem_type *)type)->tag)
    {
        case tag_mem_record:
            if (((coda_mem_record *)type)->field_type != NULL)
            {
                for (i = 0; i < ((coda_mem_record *)type)->num_fields; i++)
                {
                    if (((coda_mem_record *)type)->field_type[i] != NULL)
                    {
                        coda_dynamic_type_delete(((coda_mem_record *)type)->field_type[i]);
                    }
                }
                free(((coda_mem_record *)type)->field_type);
            }
            break;
        case tag_mem_array:
            if (((coda_mem_array *)type)->element != NULL)
            {
                for (i = 0; i < ((coda_mem_array *)type)->num_elements; i++)
                {
                    if (((coda_mem_array *)type)->element[i] != NULL)
                    {
                        coda_dynamic_type_delete(((coda_mem_array *)type)->element[i]);
                    }
                }
                free(((coda_mem_array *)type)->element);
            }
            break;
        case tag_mem_data:
            break;
        case tag_mem_special:
            if (((coda_mem_special *)type)->base_type != NULL)
            {
                coda_dynamic_type_delete(((coda_mem_special *)type)->base_type);
            }
            break;
    }
    if (((coda_mem_type *)type)->attributes != NULL)
    {
        coda_dynamic_type_delete(((coda_mem_type *)type)->attributes);
    }
    if (type->definition != NULL)
    {
        coda_type_release((coda_type *)type->definition);
    }
    free(type);
}